

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  int iVar1;
  IncorrectConstruction *__return_storage_ptr__;
  uint uVar2;
  int iVar3;
  string sStack_38;
  
  uVar2 = 0xffffffff;
  if (((this->super_OptionBase<CLI::Option>).multi_option_policy_ == Throw) &&
     (uVar2 = 1, this->expected_ < 0)) {
    uVar2 = this->type_size_ >> 0x1f | 1;
  }
  iVar1 = this->expected_ * this->type_size_;
  iVar3 = -iVar1;
  if (0 < iVar1) {
    iVar3 = iVar1;
  }
  if (-1 < (int)(iVar3 * uVar2)) {
    (this->super_OptionBase<CLI::Option>).multi_option_policy_ = value;
    return this;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  get_name_abi_cxx11_(&sStack_38,this,false,false);
  IncorrectConstruction::MultiOptionPolicy(__return_storage_ptr__,&sStack_38);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *multi_option_policy(MultiOptionPolicy value = MultiOptionPolicy::Throw) {

        if(get_items_expected() < 0)
            throw IncorrectConstruction::MultiOptionPolicy(get_name());
        multi_option_policy_ = value;
        return this;
    }